

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int get_request_handler(mg_connection *conn,int handler_type,mg_request_handler *handler,
                       mg_websocket_subprotocols **subprotocols,
                       mg_websocket_connect_handler *connect_handler,
                       mg_websocket_ready_handler *ready_handler,
                       mg_websocket_data_handler *data_handler,
                       mg_websocket_close_handler *close_handler,
                       mg_authorization_handler *auth_handler,void **cbdata,
                       mg_handler_info **handler_info)

{
  char *__s;
  mg_handler_info *pmVar1;
  ulong __n;
  mg_handler_info *pmVar2;
  int iVar3;
  size_t sVar4;
  mg_domain_context *pmVar5;
  ptrdiff_t pVar6;
  mg_authorization_handler p_Var7;
  mg_match_context *mcx;
  mg_context *pmVar8;
  uint uVar9;
  bool bVar10;
  
  iVar3 = 0;
  if ((conn != (mg_connection *)0x0) && (conn->connection_type == 1)) {
    __s = (conn->request_info).local_uri;
    mcx = (mg_match_context *)subprotocols;
    sVar4 = strlen(__s);
    pmVar8 = conn->phys_ctx;
    if ((pmVar8 != (mg_context *)0x0) &&
       (pmVar5 = conn->dom_ctx, iVar3 = 0, pmVar5 != (mg_domain_context *)0x0)) {
      if (pmVar8->context_type == 1) {
        pthread_mutex_lock((pthread_mutex_t *)&pmVar8->nonce_mutex);
        pmVar5 = conn->dom_ctx;
      }
      pmVar1 = pmVar5->handlers;
      pmVar2 = pmVar1;
      uVar9 = 0;
      do {
        for (; pmVar2 != (mg_handler_info *)0x0; pmVar2 = pmVar2->next) {
          if (pmVar2->handler_type == handler_type) {
            if (uVar9 == 1) {
              __n = pmVar2->uri_len;
              if ((__n < sVar4) && (__s[__n] == '/')) {
                iVar3 = bcmp(pmVar2->uri,__s,__n);
LAB_0011ae89:
                if (iVar3 == 0) {
LAB_0011aec6:
                  if (handler_type == 0) {
                    if (pmVar2->removing != 0) goto LAB_0011af11;
                    *handler = pmVar2->handler;
                    pmVar2->refcount = pmVar2->refcount + 1;
                    *handler_info = pmVar2;
                  }
                  else {
                    if (handler_type == 1) {
                      *subprotocols = pmVar2->subprotocols;
                      *connect_handler = pmVar2->connect_handler;
                      *ready_handler = pmVar2->ready_handler;
                      *data_handler = pmVar2->data_handler;
                      p_Var7 = (mg_authorization_handler)pmVar2->close_handler;
                    }
                    else {
                      p_Var7 = pmVar2->auth_handler;
                      close_handler = (mg_websocket_close_handler *)auth_handler;
                    }
                    *close_handler = (mg_websocket_close_handler)p_Var7;
                  }
                  *cbdata = pmVar2->cbdata;
                  pmVar8 = conn->phys_ctx;
                  iVar3 = 1;
                  goto LAB_0011af42;
                }
              }
            }
            else if (uVar9 == 0) {
              if (pmVar2->uri_len == sVar4) {
                iVar3 = strcmp(pmVar2->uri,__s);
                goto LAB_0011ae89;
              }
            }
            else if ((pmVar2->uri != (char *)0x0) &&
                    (pVar6 = mg_match_alternatives(pmVar2->uri,pmVar2->uri_len,__s,mcx), 0 < pVar6))
            goto LAB_0011aec6;
          }
        }
        bVar10 = uVar9 < 2;
        pmVar2 = pmVar1;
        uVar9 = uVar9 + 1;
      } while (bVar10);
LAB_0011af11:
      pmVar8 = conn->phys_ctx;
      iVar3 = 0;
LAB_0011af42:
      if ((pmVar8 != (mg_context *)0x0) && (pmVar8->context_type == 1)) {
        pthread_mutex_unlock((pthread_mutex_t *)&pmVar8->nonce_mutex);
      }
    }
  }
  return iVar3;
}

Assistant:

static int
get_request_handler(struct mg_connection *conn,
                    int handler_type,
                    mg_request_handler *handler,
                    struct mg_websocket_subprotocols **subprotocols,
                    mg_websocket_connect_handler *connect_handler,
                    mg_websocket_ready_handler *ready_handler,
                    mg_websocket_data_handler *data_handler,
                    mg_websocket_close_handler *close_handler,
                    mg_authorization_handler *auth_handler,
                    void **cbdata,
                    struct mg_handler_info **handler_info)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	if (request_info) {
		const char *uri = request_info->local_uri;
		size_t urilen = strlen(uri);
		struct mg_handler_info *tmp_rh;
		int step, matched;

		if (!conn || !conn->phys_ctx || !conn->dom_ctx) {
			return 0;
		}

		mg_lock_context(conn->phys_ctx);

		for (step = 0; step < 3; step++) {
			for (tmp_rh = conn->dom_ctx->handlers; tmp_rh != NULL;
			     tmp_rh = tmp_rh->next) {
				if (tmp_rh->handler_type != handler_type) {
					continue;
				}
				if (step == 0) {
					/* first try for an exact match */
					matched = (tmp_rh->uri_len == urilen)
					          && (strcmp(tmp_rh->uri, uri) == 0);
				} else if (step == 1) {
					/* next try for a partial match, we will accept
					uri/something */
					matched =
					    (tmp_rh->uri_len < urilen)
					    && (uri[tmp_rh->uri_len] == '/')
					    && (memcmp(tmp_rh->uri, uri, tmp_rh->uri_len) == 0);
				} else {
					/* finally try for pattern match */
					matched =
					    match_prefix(tmp_rh->uri, tmp_rh->uri_len, uri) > 0;
				}
				if (matched) {
					if (handler_type == WEBSOCKET_HANDLER) {
						*subprotocols = tmp_rh->subprotocols;
						*connect_handler = tmp_rh->connect_handler;
						*ready_handler = tmp_rh->ready_handler;
						*data_handler = tmp_rh->data_handler;
						*close_handler = tmp_rh->close_handler;
					} else if (handler_type == REQUEST_HANDLER) {
						if (tmp_rh->removing) {
							/* Treat as none found */
							step = 2;
							break;
						}
						*handler = tmp_rh->handler;
						/* Acquire handler and give it back */
						tmp_rh->refcount++;
						*handler_info = tmp_rh;
					} else { /* AUTH_HANDLER */
						*auth_handler = tmp_rh->auth_handler;
					}
					*cbdata = tmp_rh->cbdata;
					mg_unlock_context(conn->phys_ctx);
					return 1;
				}
			}
		}

		mg_unlock_context(conn->phys_ctx);
	}
	return 0; /* none found */
}